

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall Js::StepController::StepController(StepController *this)

{
  StepController *this_local;
  
  this->stepType = STEP_NONE;
  this->byteOffset = 0;
  Memory::RecyclerRootPtr<Js::FunctionBody>::RecyclerRootPtr(&this->body);
  this->statementMap = (StatementMap *)0x0;
  this->frameCountWhenSet = 0;
  this->returnedValueRecordingDepth = 0;
  this->frameAddrWhenSet = 0xffffffffffffffff;
  this->scriptIdWhenSet = 0xffffffff;
  this->stepCompleteOnInlineBreakpoint = false;
  this->pActivatedContext = (ScriptContext *)0x0;
  this->returnedValueList = (ReturnedValueList *)0x0;
  return;
}

Assistant:

StepController::StepController()
        : stepType(STEP_NONE),
        byteOffset(0),
        statementMap(NULL),
        frameCountWhenSet(0),
        frameAddrWhenSet((size_t)-1),
        stepCompleteOnInlineBreakpoint(false),
        pActivatedContext(NULL),
        scriptIdWhenSet(InvalidScriptId),
        returnedValueRecordingDepth(0),
        returnedValueList(nullptr)
    {
    }